

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::
TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::Matches
          (TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  *in_RDI;
  tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_> *in_stack_00000008;
  MutexBase *in_stack_00000010;
  tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_> *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  MutexBase::AssertHeld(in_stack_00000010);
  bVar1 = TupleMatches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,BasicTestExpr<1>>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_>_&>
               ::Matches((MatcherBase<const_std::tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_>_&>
                          *)in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }